

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::draw2DRectangle
          (COpenGLDriver *this,SColor color,rect<int> *position,rect<int> *clip)

{
  vector2d<int> vVar1;
  bool bVar2;
  u32 uVar3;
  u32 uVar4;
  u32 uVar5;
  u32 uVar6;
  rect<int> *in_RCX;
  vector2d<int> *in_RDX;
  undefined8 in_RDI;
  rect<int> pos;
  bool in_stack_000000dd;
  bool in_stack_000000de;
  bool in_stack_000000df;
  COpenGLDriver *in_stack_000000e0;
  vector2d<int> in_stack_ffffffffffffffd0;
  vector2d<int> vVar7;
  int local_28;
  int iStack_24;
  SColor local_4;
  
  disableTextures((COpenGLDriver *)in_stack_ffffffffffffffd0,(u32)((ulong)in_RDI >> 0x20));
  SColor::getAlpha(&local_4);
  setRenderStates2DMode(in_stack_000000e0,in_stack_000000df,in_stack_000000de,in_stack_000000dd);
  vVar7 = *in_RDX;
  vVar1 = in_RDX[1];
  if (in_RCX != (rect<int> *)0x0) {
    core::rect<int>::clipAgainst((rect<int> *)&stack0xffffffffffffffd0,in_RCX);
  }
  bVar2 = core::rect<int>::isValid((rect<int> *)&stack0xffffffffffffffd0);
  if (bVar2) {
    uVar3 = SColor::getRed(&local_4);
    uVar4 = SColor::getGreen(&local_4);
    uVar5 = SColor::getBlue(&local_4);
    uVar6 = SColor::getAlpha(&local_4);
    glColor4ub((char)uVar3,(char)uVar4,(char)uVar5,uVar6 & 0xff);
    local_28 = vVar1.X;
    iStack_24 = vVar1.Y;
    glRectf((float)vVar7.X,(float)vVar7.Y,(float)local_28,(float)iStack_24);
  }
  return;
}

Assistant:

void COpenGLDriver::draw2DRectangle(SColor color, const core::rect<s32> &position,
		const core::rect<s32> *clip)
{
	disableTextures();
	setRenderStates2DMode(color.getAlpha() < 255, false, false);

	core::rect<s32> pos = position;

	if (clip)
		pos.clipAgainst(*clip);

	if (!pos.isValid())
		return;

	glColor4ub(color.getRed(), color.getGreen(), color.getBlue(), color.getAlpha());
	glRectf(GLfloat(pos.UpperLeftCorner.X), GLfloat(pos.UpperLeftCorner.Y),
			GLfloat(pos.LowerRightCorner.X), GLfloat(pos.LowerRightCorner.Y));
}